

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O3

void bench_get_descriptor
               (vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
                *functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points,float *GW,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  double *pdVar4;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *pvVar5;
  float *pfVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  long lVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  interest_point *unaff_R13;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar19 [16];
  interest_point ipoint;
  long lStack_1f0;
  double dStack_1e8;
  double *pdStack_1e0;
  double *pdStack_1d8;
  double *pdStack_1d0;
  double dStack_1c8;
  long lStack_1c0;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *pvStack_1b8;
  double dStack_1b0;
  long lStack_1a8;
  ulong uStack_1a0;
  interest_point *piStack_198;
  ulong uStack_190;
  vector<interest_point,_std::allocator<interest_point>_> *pvStack_188;
  code *pcStack_180;
  uint local_174;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *local_170;
  uint local_164;
  vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
  *local_160;
  integral_image *local_158;
  float *local_150;
  interest_point local_144;
  
  if (*(long *)(functions + 8) != *(long *)functions) {
    uVar12 = 0;
    local_170 = data;
    local_160 = functions;
    local_158 = iimage;
    local_150 = GW;
    do {
      lVar8 = uVar12 * 0x238;
      local_164 = *(uint *)(*(long *)local_170 + 0x208 + lVar8);
      pfVar6 = (float *)(ulong)local_164;
      local_174 = 5;
      if ((int)local_164 < 5) {
        local_174 = local_164;
      }
      if (0 < (int)local_164) {
        uVar10 = (ulong)local_174;
        uVar13 = 0;
        do {
          piVar1 = (interest_points->
                   super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(interest_points->
                         super__Vector_base<interest_point,_std::allocator<interest_point>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) *
                  -0xed7303b5cc0ed73;
          if (uVar7 < uVar13 || uVar7 - uVar13 == 0) {
            pcVar11 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            pcStack_180 = perf_get_descriptor;
            uVar7 = uVar13;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar13);
            dVar15 = 1.0;
            lStack_1f0 = 100;
            pvStack_1b8 = data;
            lStack_1a8 = lVar8;
            uStack_1a0 = uVar12;
            piStack_198 = unaff_R13;
            uStack_190 = uVar13;
            pvStack_188 = interest_points;
            pcStack_180 = (code *)uVar10;
            do {
              cpuid_basic_info(0);
              uVar12 = rdtsc();
              lStack_1f0 = (long)(dVar15 * (double)lStack_1f0);
              for (lVar8 = lStack_1f0; lVar8 != 0; lVar8 = lVar8 + -1) {
                (*(code *)pcVar11)(uVar7,extraout_RDX,pfVar6);
              }
              uVar10 = rdtsc();
              cpuid_basic_info(0);
              auVar14 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                           (((ulong)(uint)-(int)(uVar12 >> 0x20) << 0x20) -
                                           (uVar12 & 0xffffffff)) +
                                           (uVar10 & 0xffffffff) + (uVar10 & 0xffffffff00000000));
              dStack_1e8 = auVar14._0_8_;
              dVar15 = 100000000.0 / dStack_1e8;
            } while (2.0 < dVar15);
            pdStack_1e0 = (double *)0x0;
            pdStack_1d8 = (double *)0x0;
            dStack_1b0 = (double)lStack_1f0;
            pdStack_1d0 = (double *)0x0;
            lVar8 = 0;
            dStack_1c8 = 0.0;
            do {
              cpuid_basic_info(0);
              uVar12 = rdtsc();
              lStack_1c0 = lVar8;
              for (lVar9 = lStack_1f0; lVar9 != 0; lVar9 = lVar9 + -1) {
                (*(code *)pcVar11)(uVar7,extraout_RDX,pfVar6);
              }
              uVar10 = rdtsc();
              cpuid_basic_info(0);
              auVar14 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                           (((ulong)(uint)-(int)(uVar12 >> 0x20) << 0x20) -
                                           (uVar12 & 0xffffffff)) +
                                           (uVar10 & 0xffffffff) + (uVar10 & 0xffffffff00000000));
              dVar15 = auVar14._0_8_ / dStack_1b0;
              dStack_1e8 = dVar15;
              if (pdStack_1d8 == pdStack_1d0) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&pdStack_1e0,
                           (iterator)pdStack_1d8,&dStack_1e8);
              }
              else {
                *pdStack_1d8 = dVar15;
                pdStack_1d8 = pdStack_1d8 + 1;
              }
              pvVar5 = pvStack_1b8;
              pdVar4 = pdStack_1d8;
              pdVar3 = pdStack_1e0;
              lVar8 = lStack_1c0 + 1;
              dStack_1c8 = dStack_1c8 + dVar15;
            } while (lVar8 != 10);
            dVar15 = dStack_1c8 / 10.0;
            lVar8 = *(long *)(pvStack_1b8 + 0x210);
            dStack_1e8 = dVar15;
            if (pdStack_1e0 != pdStack_1d8) {
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdStack_1e0,pdStack_1d8,
                         (int)LZCOUNT((long)pdStack_1d8 - (long)pdStack_1e0 >> 3) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdVar3,pdVar4);
            }
            auVar16._8_8_ = 0;
            auVar16._0_8_ = dStack_1e8;
            auVar17._0_8_ = ((double)lVar8 * 100.0) / dVar15;
            auVar17._8_8_ = 0;
            auVar19._8_8_ = 0x3fdfffffffffffff;
            auVar19._0_8_ = 0x3fdfffffffffffff;
            auVar2._8_8_ = 0x8000000000000000;
            auVar2._0_8_ = 0x8000000000000000;
            auVar14 = vpternlogq_avx512vl(auVar19,auVar17,auVar2,0xf8);
            auVar18._8_8_ = 0;
            auVar18._0_8_ = auVar17._0_8_ + auVar14._0_8_;
            auVar2 = vroundsd_avx(auVar18,auVar18,0xb);
            auVar14 = vmovhpd_avx(auVar16,*pdStack_1e0);
            auVar14 = vcvttpd2uqq_avx512vl(auVar14);
            auVar14 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pvVar5 + 0x218));
            *(undefined1 (*) [16])(pvVar5 + 0x218) = auVar14;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = pdStack_1d8[-1];
            lVar8 = vcvttsd2usi_avx512f(auVar14);
            *(long *)(pvVar5 + 0x228) = *(long *)(pvVar5 + 0x228) + lVar8;
            *(double *)(pvVar5 + 0x230) = auVar2._0_8_ / 100.0 + *(double *)(pvVar5 + 0x230);
            operator_delete(pdStack_1e0,(long)pdStack_1d0 - (long)pdStack_1e0);
            return;
          }
          unaff_R13 = &local_144;
          pcStack_180 = (code *)0x10b852;
          memcpy(unaff_R13,piVar1 + uVar13,0x114);
          data = (vector<benchmark_data,_std::allocator<benchmark_data>_> *)
                 (*(long *)local_170 + lVar8);
          pcStack_180 = (code *)0x10b87b;
          pfVar6 = local_150;
          perf_get_descriptor(*(_func_void_integral_image_ptr_interest_point_ptr_float_ptr **)
                               (*(long *)local_160 + uVar12 * 8),local_158,unaff_R13,local_150,
                              (benchmark_data *)data);
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar10);
      }
      if (local_164 != 0) {
        data = (vector<benchmark_data,_std::allocator<benchmark_data>_> *)(ulong)local_174;
        lVar9 = *(long *)local_170;
        uVar10 = (ulong)(int)local_174;
        *(ulong *)(lVar9 + 0x218 + lVar8) = *(ulong *)(lVar9 + 0x218 + lVar8) / uVar10;
        *(ulong *)(lVar9 + 0x228 + lVar8) = *(ulong *)(lVar9 + 0x228 + lVar8) / uVar10;
        *(ulong *)(lVar9 + 0x220 + lVar8) = *(ulong *)(lVar9 + 0x220 + lVar8) / uVar10;
        *(double *)(lVar9 + 0x230 + lVar8) =
             *(double *)(lVar9 + 0x230 + lVar8) / (double)(int)local_174;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(*(long *)(local_160 + 8) - *(long *)local_160 >> 3));
  }
  return;
}

Assistant:

void bench_get_descriptor(
    const std::vector<void (*)(struct integral_image *, struct interest_point *, float *)> &functions,
    struct integral_image *iimage, std::vector<struct interest_point> *interest_points, float *GW,
    std::vector<struct benchmark_data> &data) {
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {
        // Specifies how many times the timing for get_descriptor will be called. The average will be taken.
        int counter = MIN(5, data[j].num_interest_points);
        for (int i = 0; i < counter; ++i) {
            struct interest_point ipoint = interest_points->at(i);
            perf_get_descriptor(functions[j], iimage, &ipoint, GW, data[j]);
        }

        // Take the average of the runs.
        if (counter != 0) {
            data[j].avg_cycles /= counter;
            data[j].max_cycles /= counter;
            data[j].min_cycles /= counter;
            data[j].flops_per_cycle /= counter;
        }
    }
}